

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O2

void __thiscall mahjong::PatternComputer::special(PatternComputer *this,PlayerHand *hand)

{
  _Rb_tree_header *p_Var1;
  pointer pPVar2;
  bool bVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  pointer pPVar6;
  initializer_list<mahjong::Tile> __l;
  allocator_type local_109;
  PatternComputer *local_108;
  pair<const_mahjong::Tile,_int> it_1;
  Tile local_f8;
  Tile local_f4;
  PlayerHand *local_f0;
  WiningHand wining_hand;
  Tile it;
  map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  unique_tiles;
  _Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_48;
  
  p_Var1 = &unique_tiles._M_t._M_impl.super__Rb_tree_header;
  unique_tiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unique_tiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  unique_tiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108 = this;
  local_f0 = hand;
  unique_tiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  unique_tiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  PlayerHand::makeFreeTiles((FreeTiles *)&wining_hand,hand);
  pPVar2 = wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pPVar6 = wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar2;
      pPVar6 = (pointer)((long)&(pPVar6->tiles).
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4)) {
    it = *(Tile *)&(pPVar6->tiles).super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    bVar3 = IsSimple::operator()((IsSimple *)&it_1,&it);
    if (!bVar3) {
      pmVar4 = std::
               map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
               ::operator[](&unique_tiles,&it);
      *pmVar4 = *pmVar4 + 1;
    }
  }
  std::_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~_Vector_base
            ((_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&wining_hand);
  if (unique_tiles._M_t._M_impl.super__Rb_tree_header._M_node_count == 0xd) {
    wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(wining_hand.pairs.
                           super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x28);
    std::
    _Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
    ::_M_assign_unique<mahjong::Pattern_const*>
              ((_Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
                *)&local_108->highest_patterns,(Pattern *)&wining_hand,
               (Pattern *)
               ((long)&wining_hand.pairs.
                       super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wining_hand.last_tile = PlayerHand::lastTile(local_f0);
    for (p_Var5 = unique_tiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      it_1.first = p_Var5[1]._M_color;
      it_1.second = *(int *)&p_Var5[1].field_0x4;
      if (it_1.second == 2) {
        __l._M_len = 2;
        __l._M_array = &local_f8;
        local_f8 = it_1.first;
        local_f4 = it_1.first;
        std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector
                  ((vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&local_48,__l,&local_109
                  );
        Pair::Pair((Pair *)&it,(vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&local_48);
        std::_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~_Vector_base(&local_48);
        std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::push_back
                  (&wining_hand.pairs,(value_type *)&it);
        std::_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~_Vector_base
                  ((_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&it);
      }
      else {
        std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::push_back
                  (&wining_hand.tiles,&it_1.first);
      }
    }
    WiningHand::operator=(&local_108->highest_wining_hand,&wining_hand);
    WiningHand::~WiningHand(&wining_hand);
  }
  std::
  _Rb_tree<mahjong::Tile,_std::pair<const_mahjong::Tile,_int>,_std::_Select1st<std::pair<const_mahjong::Tile,_int>_>,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  ::~_Rb_tree(&unique_tiles._M_t);
  return;
}

Assistant:

void PatternComputer::special(const PlayerHand& hand)
{
	map<Tile, int> unique_tiles;
	for (auto it : hand.makeFreeTiles())
	{
		if (IsSimple()(it)) continue;
		unique_tiles[it]++;
	}

	if (13 == unique_tiles.size())
	{
		highest_patterns = { Pattern::ThirteenOrphans };

		WiningHand wining_hand;
		wining_hand.last_tile = hand.lastTile();
		for (auto it : unique_tiles)
		{
			if (2 == it.second)
			{
				auto p = Pair({ it.first, it.first });
				wining_hand.pairs.push_back(p);
			}
			else
			{
				wining_hand.tiles.push_back(it.first);
			}
		}
		highest_wining_hand = wining_hand;
	}
}